

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_addic_(DisasContext_conflict10 *ctx)

{
  DisasContext_conflict10 *ctx_local;
  
  gen_op_addic(ctx,true);
  return;
}

Assistant:

static void gen_addic_(DisasContext *ctx)
{
    gen_op_addic(ctx, 1);
}